

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructDeserializer.hpp
# Opt level: O3

void mserialize::
     StructDeserializer<binlog::WriterProp,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::id>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::WriterProp::*,_&binlog::WriterProp::name>,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::batchSize>_>
     ::deserialize<binlog::Range>(WriterProp *t,Range *istream)

{
  binlog::Range::throw_if_overflow(istream,8);
  t->id = *(uint64_t *)istream->_begin;
  istream->_begin = istream->_begin + 8;
  detail::
  BuiltinDeserializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::deserialize<binlog::Range>(&t->name,istream);
  binlog::Range::throw_if_overflow(istream,8);
  t->batchSize = *(uint64_t *)istream->_begin;
  istream->_begin = istream->_begin + 8;
  return;
}

Assistant:

static void deserialize(T& t, InputStream& istream)
  {
    using swallow = int[];
    (void)swallow{1, (deserialize_member(t, Members::value, istream), int{})...};
  }